

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cpp
# Opt level: O2

void __thiscall App::drawBoundaries(App *this,Graphics *g)

{
  float c;
  vec4 color;
  
  piksel::Graphics::push(g);
  piksel::Graphics::rectMode(g,CORNERS);
  color.field_0._8_8_ = 0x3f8000003f0e8e8f;
  color.field_0._0_8_ = 0x3f0e8e8f3f0e8e8f;
  piksel::Graphics::fill(g,color);
  piksel::Graphics::noStroke(g);
  piksel::Graphics::rect(g,0.0,32.0,(float)(this->super_BaseApp).width,64.0);
  piksel::Graphics::rect(g,0.0,64.0,32.0,(float)(this->super_BaseApp).height);
  c = (float)(this->super_BaseApp).width;
  piksel::Graphics::rect(g,c + -32.0,64.0,c,(float)(this->super_BaseApp).height);
  piksel::Graphics::imageMode(g,CORNER);
  piksel::Sprite::draw
            ((this->spritesheet).sprites.
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start + 0x26,g,0.0,140.0,32.0,32.0,true,false,false);
  piksel::Sprite::draw
            ((this->spritesheet).sprites.
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start + 0x26,g,(float)((this->super_BaseApp).width + -0x20),
             140.0,32.0,32.0,false,false,false);
  piksel::Graphics::pop(g);
  return;
}

Assistant:

void App::drawBoundaries(piksel::Graphics& g) {
    g.push();
    g.rectMode(piksel::DrawMode::CORNERS);
    g.fill(GRAY);
    g.noStroke();
    g.rect(0, BRICK_WIDTH, width, BRICK_WIDTH + BRICK_WIDTH);
    g.rect(0, BRICK_WIDTH + BRICK_WIDTH, BRICK_WIDTH, height);
    g.rect(width - BRICK_WIDTH, BRICK_WIDTH + BRICK_WIDTH, width, height);
    g.imageMode(piksel::DrawMode::CORNER);
    spritesheet.sprites[38].draw(g, 0, BRICK_WIDTH + BRICK_WIDTH + 48 + 60 - 32, 32, 32, true);
    spritesheet.sprites[38].draw(g, width - 32, BRICK_WIDTH + BRICK_WIDTH + 48 + 60 - 32, 32, 32, false);
    g.pop();
}